

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O1

string * __thiscall
libcellml::XmlNode::convertToStrippedString_abi_cxx11_(string *__return_storage_ptr__,XmlNode *this)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  pointer pcVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  pointer pcVar8;
  char *pcVar9;
  pointer pcVar10;
  
  convertToString_abi_cxx11_(__return_storage_ptr__,this);
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  uVar3 = __return_storage_ptr__->_M_string_length;
  pcVar1 = pcVar2 + uVar3;
  pcVar7 = pcVar2;
  if (0 < (long)uVar3 >> 2) {
    pcVar7 = pcVar2 + (uVar3 & 0xfffffffffffffffc);
    lVar6 = ((long)uVar3 >> 2) + 1;
    pcVar9 = pcVar2 + 3;
    do {
      iVar5 = isspace((int)pcVar9[-3]);
      if (iVar5 == 0) {
        pcVar9 = pcVar9 + -3;
        goto LAB_00298d35;
      }
      iVar5 = isspace((int)pcVar9[-2]);
      if (iVar5 == 0) {
        pcVar9 = pcVar9 + -2;
        goto LAB_00298d35;
      }
      iVar5 = isspace((int)pcVar9[-1]);
      if (iVar5 == 0) {
        pcVar9 = pcVar9 + -1;
        goto LAB_00298d35;
      }
      iVar5 = isspace((int)*pcVar9);
      if (iVar5 == 0) goto LAB_00298d35;
      lVar6 = lVar6 + -1;
      pcVar9 = pcVar9 + 4;
    } while (1 < lVar6);
  }
  lVar6 = (long)pcVar1 - (long)pcVar7;
  if (lVar6 == 1) {
LAB_00298d11:
    iVar5 = isspace((int)*pcVar7);
    pcVar9 = pcVar7;
    if (iVar5 != 0) {
      pcVar9 = pcVar1;
    }
  }
  else if (lVar6 == 2) {
LAB_00298d00:
    iVar5 = isspace((int)*pcVar7);
    pcVar9 = pcVar7;
    if (iVar5 != 0) {
      pcVar7 = pcVar7 + 1;
      goto LAB_00298d11;
    }
  }
  else {
    pcVar9 = pcVar1;
    if ((lVar6 == 3) && (iVar5 = isspace((int)*pcVar7), pcVar9 = pcVar7, iVar5 != 0)) {
      pcVar7 = pcVar7 + 1;
      goto LAB_00298d00;
    }
  }
LAB_00298d35:
  if (pcVar1 == pcVar9) {
    __return_storage_ptr__->_M_string_length = 0;
    *pcVar2 = '\0';
  }
  else {
    std::__cxx11::string::_M_erase((ulong)__return_storage_ptr__,0);
  }
  pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
  pcVar10 = pcVar4 + __return_storage_ptr__->_M_string_length;
  lVar6 = (long)__return_storage_ptr__->_M_string_length >> 2;
  pcVar8 = pcVar10;
  if (0 < lVar6) {
    pcVar8 = pcVar10 + lVar6 * -4;
    lVar6 = lVar6 + 1;
    do {
      iVar5 = isspace((int)pcVar10[-1]);
      if (iVar5 == 0) goto LAB_00298e2a;
      iVar5 = isspace((int)pcVar10[-2]);
      if (iVar5 == 0) {
        pcVar10 = pcVar10 + -1;
        goto LAB_00298e2a;
      }
      iVar5 = isspace((int)pcVar10[-3]);
      if (iVar5 == 0) {
        pcVar10 = pcVar10 + -2;
        goto LAB_00298e2a;
      }
      iVar5 = isspace((int)pcVar10[-4]);
      if (iVar5 == 0) {
        pcVar10 = pcVar10 + -3;
        goto LAB_00298e2a;
      }
      pcVar10 = pcVar10 + -4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  lVar6 = (long)pcVar8 - (long)pcVar4;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      pcVar10 = pcVar4;
      if ((lVar6 != 3) || (iVar5 = isspace((int)pcVar8[-1]), pcVar10 = pcVar8, iVar5 == 0))
      goto LAB_00298e2a;
      pcVar8 = pcVar8 + -1;
    }
    iVar5 = isspace((int)pcVar8[-1]);
    pcVar10 = pcVar8;
    if (iVar5 == 0) goto LAB_00298e2a;
    pcVar8 = pcVar8 + -1;
  }
  iVar5 = isspace((int)pcVar8[-1]);
  pcVar10 = pcVar8;
  if (iVar5 != 0) {
    pcVar10 = pcVar4;
  }
LAB_00298e2a:
  __return_storage_ptr__->_M_string_length = (long)pcVar10 - (long)pcVar4;
  *pcVar10 = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string XmlNode::convertToStrippedString() const
{
    std::string contentString = convertToString();
    contentString.erase(contentString.begin(), find_if_not(contentString.begin(), contentString.end(), [](int c) { return isspace(c); }));
    contentString.erase(find_if_not(contentString.rbegin(), contentString.rend(), [](int c) { return isspace(c); }).base(), contentString.end());
    return contentString;
}